

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool gSchemaFullChecking;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  bool gDoNamespaces;
  
  if (argC < 2) {
LAB_0010369e:
    usage();
    return 1;
  }
  uVar9 = 1;
  gSchemaFullChecking = false;
  bVar2 = false;
  gDoNamespaces = false;
  do {
    pcVar1 = argV[uVar9];
    uVar10 = uVar9;
    if (*pcVar1 != '-') break;
    iVar4 = strcmp(pcVar1,"-?");
    if (iVar4 == 0) {
      usage();
      return 2;
    }
    iVar4 = strcmp(pcVar1,"-n");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"-N"), iVar4 == 0)) {
      gDoNamespaces = true;
    }
    else {
      iVar4 = strcmp(pcVar1,"-s");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"-S"), iVar4 == 0)) {
        bVar2 = true;
      }
      else {
        iVar4 = strcmp(pcVar1,"-f");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"-F"), iVar4 == 0)) {
          gSchemaFullChecking = true;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown option \'",0x10);
          pcVar1 = argV[uVar9];
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107180);
          }
          else {
            sVar8 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\', ignoring it.\n",0x10);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
      }
    }
    uVar9 = uVar9 + 1;
    uVar10 = (ulong)(uint)argC;
  } while ((uint)argC != uVar9);
  if ((int)uVar10 + 1 != argC) goto LAB_0010369e;
  pcVar1 = argV[uVar10 & 0xffffffff];
  iVar4 = 100;
  bVar3 = false;
  do {
    if (bVar3) goto LAB_00103655;
    iVar5 = TestInit4DOM(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Once);
    iVar6 = TestInit4SAX(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Once);
    iVar7 = TestInit4SAX2(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Once);
    if (iVar7 != 0 || (iVar6 != 0 || iVar5 != 0)) {
      bVar3 = true;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (bVar3) {
LAB_0010358b:
    bVar3 = true;
  }
  else {
    iVar4 = TestInit4DOM(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Multiple);
    bVar3 = false;
    if (iVar4 != 0) goto LAB_0010358b;
  }
  if ((bVar3) ||
     (iVar4 = TestInit4SAX(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Multiple), iVar4 != 0)) {
    bVar3 = true;
  }
  if (bVar3) {
LAB_001035d9:
    bVar3 = true;
  }
  else {
    iVar4 = TestInit4SAX2(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,Multiple);
    bVar3 = false;
    if (iVar4 != 0) goto LAB_001035d9;
  }
  if (bVar3) {
LAB_00103600:
    bVar3 = true;
  }
  else {
    iVar4 = TestInit4DOM(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,UnEven);
    bVar3 = false;
    if (iVar4 != 0) goto LAB_00103600;
  }
  if (bVar3) {
LAB_00103627:
    bVar3 = true;
  }
  else {
    iVar4 = TestInit4SAX(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,UnEven);
    bVar3 = false;
    if (iVar4 != 0) goto LAB_00103627;
  }
  if (!bVar3) {
    iVar4 = TestInit4SAX2(pcVar1,gDoNamespaces,bVar2,gSchemaFullChecking,UnEven);
    bVar2 = false;
    if (iVar4 == 0) goto LAB_00103650;
  }
  bVar2 = true;
LAB_00103650:
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test Run Successfully",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    return 0;
  }
LAB_00103655:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test Failed",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return 4;
}

Assistant:

int main(int argC, char* argV[]) {

    // ---------------------------------------------------------------------------
    //  Local data
    //
    //  gDoNamespaces
    //      Indicates whether namespace processing should be done.
    //
    //  gDoSchema
    //      Indicates whether schema processing should be done.
    //
    //  gSchemaFullChecking
    //      Indicates whether full schema constraint checking should be done.
    //
    // ---------------------------------------------------------------------------
    bool gDoNamespaces          = false;
    bool gDoSchema              = false;
    bool gSchemaFullChecking    = false;

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        return 1;
    }

    char* xmlFile = argV[parmInd];
    bool error = false;

    //
    // Calling Init/Term pair a number of times
    //
    unsigned int i = 0;
    for (i=0; i < 100; i++) {
        if (error) {
            std::cout << "Test Failed" << std::endl;
            return 4;
        }

        if (TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
    }

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
/*
 * The following Limit test is a stress test that can run a long time
 * Commented out for regular sanity test
 */
/*
    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
*/

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;

    if (error) {
        std::cout << "Test Failed" << std::endl;
        return 4;
    }

    std::cout << "Test Run Successfully" << std::endl;
    return 0;
}